

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall
HighsSymmetryDetection::backtrack
          (HighsSymmetryDetection *this,HighsInt backtrackStackNewEnd,HighsInt backtrackStackEnd)

{
  value_type vVar1;
  int iVar2;
  HighsInt HVar3;
  reference pvVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HighsInt currEnd;
  HighsInt newStart;
  HighsInt cell;
  HighsInt stackPos;
  HighsInt in_stack_ffffffffffffffe4;
  value_type vVar5;
  
  for (iVar2 = in_EDX + -1; in_ESI <= iVar2; iVar2 = iVar2 + -1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)iVar2);
    vVar5 = *pvVar4;
    HVar3 = getCellStart((HighsSymmetryDetection *)CONCAT44(iVar2,vVar5),in_stack_ffffffffffffffe4);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)vVar5);
    vVar1 = *pvVar4;
    in_stack_ffffffffffffffe4 = HVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),(long)vVar5);
    *pvVar4 = HVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x80),
                        (long)in_stack_ffffffffffffffe4);
    *pvVar4 = vVar1;
  }
  return;
}

Assistant:

void HighsSymmetryDetection::backtrack(HighsInt backtrackStackNewEnd,
                                       HighsInt backtrackStackEnd) {
  // we assume that we always backtrack from a leaf node, i.e. a discrete
  // partition therefore we do not need to remember the values of the hash
  // contributions as it is the indentity for each position and all new cells
  // are on the cell creation stack.
  for (HighsInt stackPos = backtrackStackEnd - 1;
       stackPos >= backtrackStackNewEnd; --stackPos) {
    HighsInt cell = cellCreationStack[stackPos];
    // look up the cell start of the preceding cell with link compression
    HighsInt newStart = getCellStart(cell - 1);
    // remember the current end
    HighsInt currEnd = currentPartitionLinks[cell];
    // change the link to point to the start of the preceding cell
    currentPartitionLinks[cell] = newStart;
    // change the link of the start pointer of the preceding cell to point to
    // the end of this cell
    currentPartitionLinks[newStart] = currEnd;
  }
}